

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
ReadColumnSizes<false>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>
           *this)

{
  int iVar1;
  int iVar2;
  ColumnSizeHandler *in_RDI;
  CStringRef unaff_retaddr;
  int size;
  int i;
  int prev_size;
  ColumnSizeHandler size_handler;
  int num_sizes;
  undefined8 in_stack_ffffffffffffffc8;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe4;
  BasicCStringRef<char> local_18;
  undefined4 in_stack_fffffffffffffff0;
  ColumnSizeHandler *this_00;
  
  iVar2 = **(int **)(in_RDI + 8) + -1;
  this_00 = in_RDI;
  iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                    ((BinaryReader<mp::internal::EndiannessConverter> *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar1 != iVar2) {
    in_stack_ffffffffffffffc8 = *(undefined8 *)in_RDI;
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"expected {}");
    BinaryReaderBase::ReportError<int>
              ((BinaryReaderBase *)this_00,unaff_retaddr,
               (int *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  }
  BinaryReaderBase::ReadTillEndOfLine(*(BinaryReaderBase **)in_RDI);
  NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::OnColumnSizes((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x162a29);
  uVar3 = 0;
  for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
    BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
              ((BinaryReader<mp::internal::EndiannessConverter> *)
               CONCAT44(in_stack_ffffffffffffffe4,uVar3));
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::ColumnSizeHandler::Add(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    BinaryReaderBase::ReadTillEndOfLine(*(BinaryReaderBase **)in_RDI);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}